

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParserTests.cpp
# Opt level: O0

void __thiscall ParserTest_LogicalExpression_Test::TestBody(ParserTest_LogicalExpression_Test *this)

{
  __single_object node;
  unique_ptr<Node,_std::default_delete<Node>_> *in_stack_000003c0;
  function<std::unique_ptr<Node,_std::default_delete<Node>_>_(Parser_*)> *in_stack_000003c8;
  string *in_stack_000003d0;
  unique_ptr<BinaryOpNode,_std::default_delete<BinaryOpNode>_> *in_stack_fffffffffffffe08;
  unique_ptr<BinaryOpNode,_std::default_delete<BinaryOpNode>_> *in_stack_fffffffffffffe10;
  unique_ptr<BinaryOpNode,_std::default_delete<BinaryOpNode>_> *this_00;
  unique_ptr<BinaryOpNode,_std::default_delete<BinaryOpNode>_> *in_stack_fffffffffffffe18;
  unique_ptr<Node,_std::default_delete<Node>_> *in_stack_fffffffffffffe20;
  unique_ptr<Node,_std::default_delete<Node>_> *this_01;
  offset_in_Parser_to_subr *in_stack_fffffffffffffe28;
  allocator<char> *__f;
  function<std::unique_ptr<Node,_std::default_delete<Node>_>_(Parser_*)> *this_02;
  allocator<char> *__a;
  _Head_base<0UL,_BinaryOpNode_*,_false> in_stack_fffffffffffffe48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe50;
  unique_ptr<BinaryOpNode,_std::default_delete<BinaryOpNode>_> *in_stack_fffffffffffffe58;
  _Head_base<0UL,_BinaryOpNode_*,_false> in_stack_fffffffffffffe60;
  unique_ptr<BinaryOpNode,_std::default_delete<BinaryOpNode>_> *in_stack_fffffffffffffe68;
  allocator<char> local_179;
  string local_178 [36];
  undefined4 local_154;
  undefined4 local_148;
  undefined4 local_144;
  undefined4 local_130;
  undefined4 local_12c;
  undefined4 local_120;
  undefined4 local_11c;
  undefined4 local_108;
  undefined4 local_104;
  undefined4 local_f8;
  undefined4 local_f4;
  unique_ptr<Node,_std::default_delete<Node>_> local_d8 [2];
  code *local_c8;
  undefined8 local_c0;
  function<std::unique_ptr<Node,_std::default_delete<Node>_>_(Parser_*)> local_b8;
  allocator<char> local_91;
  string local_90 [36];
  undefined4 local_6c;
  undefined4 local_60;
  undefined4 local_5c;
  undefined4 local_48;
  undefined4 local_34;
  undefined4 local_28;
  undefined4 local_24;
  
  local_24 = 2;
  std::make_unique<NumericLiteralNode,int>((int *)in_stack_fffffffffffffe28);
  local_28 = 0xd;
  local_34 = 5;
  std::make_unique<NumericLiteralNode,int>((int *)in_stack_fffffffffffffe28);
  std::
  make_unique<BinaryOpNode,std::unique_ptr<NumericLiteralNode,std::default_delete<NumericLiteralNode>>,BinaryOperator,std::unique_ptr<NumericLiteralNode,std::default_delete<NumericLiteralNode>>>
            ((unique_ptr<NumericLiteralNode,_std::default_delete<NumericLiteralNode>_> *)
             in_stack_fffffffffffffe68,(BinaryOperator *)in_stack_fffffffffffffe60._M_head_impl,
             (unique_ptr<NumericLiteralNode,_std::default_delete<NumericLiteralNode>_> *)
             in_stack_fffffffffffffe58);
  local_48 = 5;
  local_5c = 2;
  std::make_unique<NumericLiteralNode,int>((int *)in_stack_fffffffffffffe28);
  local_60 = 0x10;
  local_6c = 2;
  std::make_unique<NumericLiteralNode,int>((int *)in_stack_fffffffffffffe28);
  std::
  make_unique<BinaryOpNode,std::unique_ptr<NumericLiteralNode,std::default_delete<NumericLiteralNode>>,BinaryOperator,std::unique_ptr<NumericLiteralNode,std::default_delete<NumericLiteralNode>>>
            ((unique_ptr<NumericLiteralNode,_std::default_delete<NumericLiteralNode>_> *)
             in_stack_fffffffffffffe68,(BinaryOperator *)in_stack_fffffffffffffe60._M_head_impl,
             (unique_ptr<NumericLiteralNode,_std::default_delete<NumericLiteralNode>_> *)
             in_stack_fffffffffffffe58);
  std::
  make_unique<BinaryOpNode,std::unique_ptr<BinaryOpNode,std::default_delete<BinaryOpNode>>,BinaryOperator,std::unique_ptr<BinaryOpNode,std::default_delete<BinaryOpNode>>>
            (in_stack_fffffffffffffe68,(BinaryOperator *)in_stack_fffffffffffffe60._M_head_impl,
             in_stack_fffffffffffffe58);
  std::unique_ptr<BinaryOpNode,_std::default_delete<BinaryOpNode>_>::~unique_ptr
            (in_stack_fffffffffffffe10);
  std::unique_ptr<NumericLiteralNode,_std::default_delete<NumericLiteralNode>_>::~unique_ptr
            ((unique_ptr<NumericLiteralNode,_std::default_delete<NumericLiteralNode>_> *)
             in_stack_fffffffffffffe10);
  std::unique_ptr<NumericLiteralNode,_std::default_delete<NumericLiteralNode>_>::~unique_ptr
            ((unique_ptr<NumericLiteralNode,_std::default_delete<NumericLiteralNode>_> *)
             in_stack_fffffffffffffe10);
  std::unique_ptr<BinaryOpNode,_std::default_delete<BinaryOpNode>_>::~unique_ptr
            (in_stack_fffffffffffffe10);
  std::unique_ptr<NumericLiteralNode,_std::default_delete<NumericLiteralNode>_>::~unique_ptr
            ((unique_ptr<NumericLiteralNode,_std::default_delete<NumericLiteralNode>_> *)
             in_stack_fffffffffffffe10);
  std::unique_ptr<NumericLiteralNode,_std::default_delete<NumericLiteralNode>_>::~unique_ptr
            ((unique_ptr<NumericLiteralNode,_std::default_delete<NumericLiteralNode>_> *)
             in_stack_fffffffffffffe10);
  __a = &local_91;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffe50,(char *)in_stack_fffffffffffffe48._M_head_impl,__a);
  local_c8 = Parser::parseLogicalExpression;
  local_c0 = 0;
  this_02 = &local_b8;
  std::function<std::unique_ptr<Node,std::default_delete<Node>>(Parser*)>::
  function<std::unique_ptr<ExpressionNode,std::default_delete<ExpressionNode>>(Parser::*)(),void>
            (this_02,in_stack_fffffffffffffe28);
  std::unique_ptr<Node,std::default_delete<Node>>::
  unique_ptr<BinaryOpNode,std::default_delete<BinaryOpNode>,void>
            (in_stack_fffffffffffffe20,in_stack_fffffffffffffe18);
  setupTest(in_stack_000003d0,in_stack_000003c8,in_stack_000003c0);
  std::unique_ptr<Node,_std::default_delete<Node>_>::~unique_ptr(in_stack_fffffffffffffe20);
  std::function<std::unique_ptr<Node,_std::default_delete<Node>_>_(Parser_*)>::~function
            ((function<std::unique_ptr<Node,_std::default_delete<Node>_>_(Parser_*)> *)0x1d0108);
  std::__cxx11::string::~string(local_90);
  std::allocator<char>::~allocator(&local_91);
  local_f4 = 2;
  std::make_unique<NumericLiteralNode,int>((int *)in_stack_fffffffffffffe28);
  local_f8 = 0xf;
  local_104 = 5;
  std::make_unique<NumericLiteralNode,int>((int *)in_stack_fffffffffffffe28);
  std::
  make_unique<BinaryOpNode,std::unique_ptr<NumericLiteralNode,std::default_delete<NumericLiteralNode>>,BinaryOperator,std::unique_ptr<NumericLiteralNode,std::default_delete<NumericLiteralNode>>>
            ((unique_ptr<NumericLiteralNode,_std::default_delete<NumericLiteralNode>_> *)
             in_stack_fffffffffffffe68,(BinaryOperator *)in_stack_fffffffffffffe60._M_head_impl,
             (unique_ptr<NumericLiteralNode,_std::default_delete<NumericLiteralNode>_> *)
             in_stack_fffffffffffffe58);
  local_108 = 6;
  local_11c = 2;
  std::make_unique<NumericLiteralNode,int>((int *)in_stack_fffffffffffffe28);
  local_120 = 0x10;
  local_12c = 2;
  std::make_unique<NumericLiteralNode,int>((int *)in_stack_fffffffffffffe28);
  std::
  make_unique<BinaryOpNode,std::unique_ptr<NumericLiteralNode,std::default_delete<NumericLiteralNode>>,BinaryOperator,std::unique_ptr<NumericLiteralNode,std::default_delete<NumericLiteralNode>>>
            ((unique_ptr<NumericLiteralNode,_std::default_delete<NumericLiteralNode>_> *)
             in_stack_fffffffffffffe68,(BinaryOperator *)in_stack_fffffffffffffe60._M_head_impl,
             (unique_ptr<NumericLiteralNode,_std::default_delete<NumericLiteralNode>_> *)
             in_stack_fffffffffffffe58);
  std::
  make_unique<BinaryOpNode,std::unique_ptr<BinaryOpNode,std::default_delete<BinaryOpNode>>,BinaryOperator,std::unique_ptr<BinaryOpNode,std::default_delete<BinaryOpNode>>>
            (in_stack_fffffffffffffe68,(BinaryOperator *)in_stack_fffffffffffffe60._M_head_impl,
             in_stack_fffffffffffffe58);
  local_130 = 5;
  local_144 = 4;
  std::make_unique<NumericLiteralNode,int>((int *)in_stack_fffffffffffffe28);
  local_148 = 0xc;
  local_154 = 2;
  std::make_unique<NumericLiteralNode,int>((int *)in_stack_fffffffffffffe28);
  std::
  make_unique<BinaryOpNode,std::unique_ptr<NumericLiteralNode,std::default_delete<NumericLiteralNode>>,BinaryOperator,std::unique_ptr<NumericLiteralNode,std::default_delete<NumericLiteralNode>>>
            ((unique_ptr<NumericLiteralNode,_std::default_delete<NumericLiteralNode>_> *)
             in_stack_fffffffffffffe68,(BinaryOperator *)in_stack_fffffffffffffe60._M_head_impl,
             (unique_ptr<NumericLiteralNode,_std::default_delete<NumericLiteralNode>_> *)
             in_stack_fffffffffffffe58);
  std::
  make_unique<BinaryOpNode,std::unique_ptr<BinaryOpNode,std::default_delete<BinaryOpNode>>,BinaryOperator,std::unique_ptr<BinaryOpNode,std::default_delete<BinaryOpNode>>>
            (in_stack_fffffffffffffe68,(BinaryOperator *)in_stack_fffffffffffffe60._M_head_impl,
             in_stack_fffffffffffffe58);
  this_01 = local_d8;
  std::unique_ptr<BinaryOpNode,_std::default_delete<BinaryOpNode>_>::operator=
            (in_stack_fffffffffffffe10,in_stack_fffffffffffffe08);
  std::unique_ptr<BinaryOpNode,_std::default_delete<BinaryOpNode>_>::~unique_ptr
            (in_stack_fffffffffffffe10);
  std::unique_ptr<BinaryOpNode,_std::default_delete<BinaryOpNode>_>::~unique_ptr
            (in_stack_fffffffffffffe10);
  std::unique_ptr<NumericLiteralNode,_std::default_delete<NumericLiteralNode>_>::~unique_ptr
            ((unique_ptr<NumericLiteralNode,_std::default_delete<NumericLiteralNode>_> *)
             in_stack_fffffffffffffe10);
  std::unique_ptr<NumericLiteralNode,_std::default_delete<NumericLiteralNode>_>::~unique_ptr
            ((unique_ptr<NumericLiteralNode,_std::default_delete<NumericLiteralNode>_> *)
             in_stack_fffffffffffffe10);
  std::unique_ptr<BinaryOpNode,_std::default_delete<BinaryOpNode>_>::~unique_ptr
            (in_stack_fffffffffffffe10);
  std::unique_ptr<BinaryOpNode,_std::default_delete<BinaryOpNode>_>::~unique_ptr
            (in_stack_fffffffffffffe10);
  std::unique_ptr<NumericLiteralNode,_std::default_delete<NumericLiteralNode>_>::~unique_ptr
            ((unique_ptr<NumericLiteralNode,_std::default_delete<NumericLiteralNode>_> *)
             in_stack_fffffffffffffe10);
  std::unique_ptr<NumericLiteralNode,_std::default_delete<NumericLiteralNode>_>::~unique_ptr
            ((unique_ptr<NumericLiteralNode,_std::default_delete<NumericLiteralNode>_> *)
             in_stack_fffffffffffffe10);
  std::unique_ptr<BinaryOpNode,_std::default_delete<BinaryOpNode>_>::~unique_ptr
            (in_stack_fffffffffffffe10);
  std::unique_ptr<NumericLiteralNode,_std::default_delete<NumericLiteralNode>_>::~unique_ptr
            ((unique_ptr<NumericLiteralNode,_std::default_delete<NumericLiteralNode>_> *)
             in_stack_fffffffffffffe10);
  std::unique_ptr<NumericLiteralNode,_std::default_delete<NumericLiteralNode>_>::~unique_ptr
            ((unique_ptr<NumericLiteralNode,_std::default_delete<NumericLiteralNode>_> *)
             in_stack_fffffffffffffe10);
  __f = &local_179;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffe50,(char *)in_stack_fffffffffffffe48._M_head_impl,__a);
  this_00 = (unique_ptr<BinaryOpNode,_std::default_delete<BinaryOpNode>_> *)&stack0xfffffffffffffe60
  ;
  std::function<std::unique_ptr<Node,std::default_delete<Node>>(Parser*)>::
  function<std::unique_ptr<ExpressionNode,std::default_delete<ExpressionNode>>(Parser::*)(),void>
            (this_02,(offset_in_Parser_to_subr *)__f);
  std::unique_ptr<Node,std::default_delete<Node>>::
  unique_ptr<BinaryOpNode,std::default_delete<BinaryOpNode>,void>
            (this_01,(unique_ptr<BinaryOpNode,_std::default_delete<BinaryOpNode>_> *)
                     &stack0xfffffffffffffe48);
  setupTest(in_stack_000003d0,in_stack_000003c8,in_stack_000003c0);
  std::unique_ptr<Node,_std::default_delete<Node>_>::~unique_ptr(this_01);
  std::function<std::unique_ptr<Node,_std::default_delete<Node>_>_(Parser_*)>::~function
            ((function<std::unique_ptr<Node,_std::default_delete<Node>_>_(Parser_*)> *)0x1d0425);
  std::__cxx11::string::~string(local_178);
  std::allocator<char>::~allocator(&local_179);
  std::unique_ptr<BinaryOpNode,_std::default_delete<BinaryOpNode>_>::~unique_ptr(this_00);
  return;
}

Assistant:

TEST(ParserTest, LogicalExpression)
{
  auto node = 
    std::make_unique<BinaryOpNode>(
      std::make_unique<BinaryOpNode>(
        std::make_unique<NumericLiteralNode>(2),
        BinaryOperator::GreaterEq,
        std::make_unique<NumericLiteralNode>(5)),
      BinaryOperator::LogicalAnd,
      std::make_unique<BinaryOpNode>(
        std::make_unique<NumericLiteralNode>(2),
        BinaryOperator::Equal,
        std::make_unique<NumericLiteralNode>(2)));
  setupTest("2 >= 5 && 2 == 2", &Parser::parseLogicalExpression, std::move(node));

  node = 
    std::make_unique<BinaryOpNode>(
      std::make_unique<BinaryOpNode>(
        std::make_unique<BinaryOpNode>(
          std::make_unique<NumericLiteralNode>(2),
          BinaryOperator::LessEq,
          std::make_unique<NumericLiteralNode>(5)),
        BinaryOperator::LogicalOr,
        std::make_unique<BinaryOpNode>(
          std::make_unique<NumericLiteralNode>(2),
          BinaryOperator::Equal,
          std::make_unique<NumericLiteralNode>(2))),
      BinaryOperator::LogicalAnd,
      std::make_unique<BinaryOpNode>(
        std::make_unique<NumericLiteralNode>(4),
        BinaryOperator::Greater,
        std::make_unique<NumericLiteralNode>(2)));
  setupTest("2 <= 5 || 2 == 2 && 4 > 2", &Parser::parseLogicalExpression, std::move(node));
}